

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IncDecVerify.cpp
# Opt level: O0

void incdec_verify::PostDecTestInt16(void)

{
  bool bVar1;
  SafeIntException *anon_var_0;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> vv;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> si;
  bool fSuccess;
  size_t i;
  allocator *in_stack_ffffffffffffffa0;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *this;
  allocator local_49;
  string local_48 [42];
  short local_1e;
  undefined1 in_stack_ffffffffffffffed;
  short in_stack_ffffffffffffffee;
  undefined2 in_stack_fffffffffffffff0;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> SVar2;
  uint in_stack_fffffffffffffff4;
  ulong local_8;
  
  for (local_8 = 0; local_8 < 9; local_8 = local_8 + 1) {
    in_stack_fffffffffffffff4 = CONCAT13(1,(int3)in_stack_fffffffffffffff4);
    this = (SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
           )&stack0xfffffffffffffff4;
    SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::SafeInt
              (this,(short *)(dec_int16 + local_8 * 6));
    local_1e = (short)SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                      ::operator--(this,(int)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
    SVar2 = (SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>)
            local_1e;
    bVar1 = operator!=((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        )0x0,0);
    if (bVar1) {
      in_stack_fffffffffffffff4 = in_stack_fffffffffffffff4 & 0xffffff;
    }
    if (((byte)(in_stack_fffffffffffffff4 >> 0x18) & 1) != (dec_int16[local_8 * 6 + 4] & 1)) {
      in_stack_ffffffffffffffa0 = &local_49;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_48,"Error in case dec_int16 throw (2): ",in_stack_ffffffffffffffa0);
      err_msg<short>((string *)
                     CONCAT44(in_stack_fffffffffffffff4,
                              CONCAT22(SVar2.m_int,in_stack_fffffffffffffff0)),
                     in_stack_ffffffffffffffee,(bool)in_stack_ffffffffffffffed);
      std::__cxx11::string::~string(local_48);
      std::allocator<char>::~allocator((allocator<char> *)&local_49);
    }
  }
  return;
}

Assistant:

void PostDecTestInt16()
{
	size_t i;

	for( i = 0; i < COUNTOF(dec_int16); ++i )
	{
		bool fSuccess = true;
		try
		{
			SafeInt< std::int16_t > si(dec_int16[i].x);
			SafeInt< std::int16_t > vv = si--;

			if(vv != dec_int16[i].x)
			{
				fSuccess = false;
			}
		}
		catch(SafeIntException&)
		{
			fSuccess = false;
		}

		if( fSuccess != dec_int16[i].fExpected )
		{
			err_msg( "Error in case dec_int16 throw (2): ", dec_int16[i].x, dec_int16[i].fExpected );
		}
	}
}